

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDepends.cxx
# Opt level: O2

void __thiscall cmDepends::Clear(cmDepends *this,char *file)

{
  ostream *poVar1;
  cmGeneratedFileStream depFileStream;
  char *local_278 [4];
  cmGeneratedFileStream local_258;
  
  if (this->Verbose == true) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_258);
    poVar1 = std::operator<<((ostream *)&local_258,"Clearing dependencies in \"");
    poVar1 = std::operator<<(poVar1,file);
    poVar1 = std::operator<<(poVar1,"\".");
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::stringbuf::str();
    cmSystemTools::Stdout(local_278[0]);
    std::__cxx11::string::~string((string *)local_278);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_258);
  }
  cmGeneratedFileStream::cmGeneratedFileStream(&local_258,file,false,None);
  poVar1 = std::operator<<((ostream *)&local_258,"# Empty dependencies file\n");
  poVar1 = std::operator<<(poVar1,"# This may be replaced when dependencies are built.");
  std::endl<char,std::char_traits<char>>(poVar1);
  cmGeneratedFileStream::~cmGeneratedFileStream(&local_258);
  return;
}

Assistant:

void cmDepends::Clear(const char* file)
{
  // Print verbose output.
  if (this->Verbose) {
    std::ostringstream msg;
    msg << "Clearing dependencies in \"" << file << "\"." << std::endl;
    cmSystemTools::Stdout(msg.str().c_str());
  }

  // Write an empty dependency file.
  cmGeneratedFileStream depFileStream(file);
  depFileStream << "# Empty dependencies file\n"
                << "# This may be replaced when dependencies are built."
                << std::endl;
}